

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O2

double sdf::SDF(Vector3d *location,
               vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  operation_t oVar1;
  Primitive *pPVar2;
  pointer ppPVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar4;
  double extraout_XMM0_Qa_02;
  double local_d8;
  Vector3d location_warped;
  Transform<double,_3,_2,_0> local_b8;
  
  ppPVar3 = (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_d8 = 0.0;
  do {
    if (ppPVar3 ==
        (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return local_d8;
    }
    Eigen::Transform<double,_3,_2,_0>::inverse(&local_b8,&(*ppPVar3)->transformation,Affine);
    Eigen::internal::
    transform_right_product_impl<Eigen::Transform<double,_3,_2,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1>
    ::run(&location_warped,&local_b8,location);
    pPVar2 = *ppPVar3;
    if (ppPVar3 ==
        (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      (**pPVar2->_vptr_Primitive)(pPVar2,&location_warped);
      local_d8 = extraout_XMM0_Qa_00;
    }
    else {
      oVar1 = pPVar2->operation;
      if (oVar1 == bool_intersection) {
        (**pPVar2->_vptr_Primitive)(pPVar2,&location_warped);
        dVar4 = extraout_XMM0_Qa_02;
      }
      else {
        if (oVar1 != bool_subtraction) {
          if ((oVar1 == bool_union) &&
             ((**pPVar2->_vptr_Primitive)(pPVar2,&location_warped), extraout_XMM0_Qa <= local_d8)) {
            local_d8 = extraout_XMM0_Qa;
          }
          goto LAB_0010e923;
        }
        (**pPVar2->_vptr_Primitive)(pPVar2,&location_warped);
        dVar4 = -extraout_XMM0_Qa_01;
      }
      if (local_d8 <= dVar4) {
        local_d8 = dVar4;
      }
    }
LAB_0010e923:
    ppPVar3 = ppPVar3 + 1;
  } while( true );
}

Assistant:

double 
  SDF(const Eigen::Vector3d &location, const std::vector<Primitive*> &primitives)
  {
    double d_value = 0.0;

    for(std::vector<Primitive*>::const_iterator it = primitives.begin(); it != primitives.end(); ++it)
    {
      Eigen::Vector3d location_warped = it[0]->transformation.inverse()*location;
      if( it == primitives.begin() ) d_value = it[0]->signedDistance(location_warped);
      else
      {
        switch(it[0]->operation)
        {
          case bool_union :
            d_value = std::min( it[0]->signedDistance(location_warped), d_value);
          
            break;
          case bool_intersection :
            d_value = std::max( it[0]->signedDistance(location_warped), d_value);
            break;
          
          case bool_subtraction :
            d_value = std::max( -it[0]->signedDistance(location_warped), d_value);
            break;
        } 
      }
    }
    return d_value;
  }